

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O1

void test_read_num<double,long_long,int(*)(char_const**,double*)>
               (longlong num1,_func_int_char_ptr_ptr_double_ptr *read_f,bool is_ok)

{
  byte bVar1;
  mp_type mVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  ulong uVar8;
  double dVar9;
  undefined7 in_register_00000011;
  long lVar10;
  undefined8 *puVar11;
  char *unaff_RBP;
  char *pcVar12;
  char (*mp_nums_00) [16];
  code *pcVar13;
  char *fmt;
  ulong uVar14;
  undefined8 *puVar15;
  char *pcVar16;
  byte *__maxlen;
  char *pcVar17;
  bool bVar18;
  char *mp_num_pos2;
  double num2;
  char str [256];
  char mp_nums [16] [16];
  double dStack_6e8;
  undefined1 *puStack_6e0;
  char acStack_6d8 [256];
  undefined1 uStack_5d8;
  undefined8 uStack_5d7;
  undefined1 auStack_5cf [247];
  undefined8 *puStack_4d8;
  byte *pbStack_4d0;
  code *pcStack_4c8;
  double dStack_4b8;
  undefined8 *puStack_4b0;
  char (*pacStack_4a8) [16];
  char acStack_4a0 [256];
  byte bStack_3a0;
  undefined1 auStack_39f [2];
  undefined1 auStack_39d [6];
  undefined8 uStack_397;
  undefined8 uStack_38f;
  long lStack_298;
  ulong uStack_290;
  char *pcStack_288;
  char *pcStack_280;
  char *pcStack_278;
  code *pcStack_270;
  ulong local_268;
  char *local_260;
  float local_258;
  undefined4 local_254;
  double local_250;
  double local_248;
  _func_int_char_ptr_ptr_double_ptr *local_240;
  char local_238 [256];
  byte local_138;
  undefined8 local_137;
  char acStack_12f [255];
  
  local_254 = (undefined4)CONCAT71(in_register_00000011,is_ok);
  builtin_strncpy(local_238,"typed read of ",0xf);
  pcStack_270 = (code *)0x1316e2;
  local_240 = read_f;
  iVar3 = snprintf(local_238 + 0xe,0xf2,"%lld",num1);
  pcVar16 = local_238 + (long)iVar3 + 0xe;
  pcStack_270 = (code *)0x131703;
  iVar3 = snprintf(pcVar16,(size_t)(&local_138 + -(long)pcVar16)," into ");
  pcStack_270 = (code *)0x13171d;
  snprintf(pcVar16 + iVar3,(size_t)(&local_138 + -(long)(pcVar16 + iVar3)),"double");
  pcStack_270 = (code *)0x13172c;
  _space((FILE *)_stdout);
  pcStack_270 = (code *)0x131745;
  fwrite("# ",2,1,_stdout);
  pcStack_270 = (code *)0x131752;
  fputs(local_238,_stdout);
  pcStack_270 = (code *)0x13175f;
  fputc(10,_stdout);
  mp_nums_00 = (char (*) [16])&local_138;
  pcStack_270 = (code *)0x131773;
  local_268 = num1;
  uVar4 = test_encode_int_all_sizes(mp_nums_00,num1);
  if (0 < (int)uVar4) {
    local_258 = (float)(long)local_268;
    local_250 = (double)(long)local_268;
    uVar14 = (ulong)uVar4;
    pcVar17 = (char *)((long)&local_137 + 1);
    lVar10 = 0;
    do {
      lVar5 = lVar10 * 0x10;
      bVar1 = pcVar17[-2];
      uVar8 = (ulong)bVar1;
      mVar2 = mp_type_hint[uVar8];
      pcVar12 = pcVar17;
      if (mVar2 == MP_UINT) {
        switch(bVar1) {
        case 0xcc:
          uVar8 = (ulong)(byte)pcVar17[-1];
          break;
        case 0xcd:
          uVar8 = (ulong)(ushort)(*(ushort *)(pcVar17 + -1) << 8 | *(ushort *)(pcVar17 + -1) >> 8);
          pcVar12 = acStack_12f + lVar5 + -6;
          break;
        case 0xce:
          uVar4 = *(uint *)(pcVar17 + -1);
          uVar8 = (ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                         uVar4 << 0x18);
          pcVar12 = acStack_12f + lVar5 + -4;
          break;
        case 0xcf:
          uVar8 = *(ulong *)(pcVar17 + -1);
          uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                  (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                  (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28
                  | uVar8 << 0x38;
          pcVar12 = acStack_12f + lVar10 * 0x10;
          break;
        default:
          if ((char)bVar1 < '\0') {
LAB_00131a67:
            pcStack_270 = (code *)0x131a6c;
            test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00131a6c:
            pcStack_270 = (code *)0x131a71;
            test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00131a71:
            pcStack_270 = (code *)0x131a90;
            __assert_fail("c == 0xcb",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                          ,0x987,"double mp_decode_double(const char **)");
          }
          pcVar12 = acStack_12f + (lVar10 * 2 + -1) * 8;
        }
        if (uVar8 != local_268) {
          pcStack_270 = (code *)0x131ab9;
          test_read_num<double,long_long,int(*)(char_const**,double*)>();
LAB_00131ab9:
          pcStack_270 = test_read_num<double,float,int(*)(char_const**,double*)>;
          test_read_num<double,long_long,int(*)(char_const**,double*)>();
          builtin_strncpy(acStack_4a0,"typed read of ",0xf);
          pcStack_4c8 = (code *)0x131b1e;
          pacStack_4a8 = mp_nums_00;
          lStack_298 = lVar10;
          uStack_290 = uVar14;
          pcStack_288 = pcVar16;
          pcStack_280 = pcVar12;
          pcStack_278 = pcVar17;
          pcStack_270 = (code *)unaff_RBP;
          iVar3 = snprintf(acStack_4a0 + 0xe,0xf2,"%f",0x41590b2200000000);
          pcVar16 = acStack_4a0 + (long)iVar3 + 0xe;
          pcStack_4c8 = (code *)0x131b3f;
          iVar3 = snprintf(pcVar16,(size_t)(&bStack_3a0 + -(long)pcVar16)," into ");
          __maxlen = &bStack_3a0 + -(long)(pcVar16 + iVar3);
          pcStack_4c8 = (code *)0x131b59;
          snprintf(pcVar16 + iVar3,(size_t)__maxlen,"double");
          pcStack_4c8 = (code *)0x131b68;
          _space((FILE *)_stdout);
          lVar5 = 1;
          pcStack_4c8 = (code *)0x131b87;
          fwrite("# ",2,1,_stdout);
          pcStack_4c8 = (code *)0x131b94;
          fputs(acStack_4a0,_stdout);
          pcVar13 = (code *)0xa;
          pcStack_4c8 = (code *)0x131ba1;
          fputc(10,_stdout);
          puVar15 = (undefined8 *)(auStack_39f + 1);
          bStack_3a0 = 0xca;
          _auStack_39f = 0x1059c84a;
          uStack_397._7_1_ = 0xcb;
          uStack_38f = 0x220b5941;
          lVar10 = 0;
          goto LAB_00131bd0;
        }
      }
      else if (mVar2 == MP_FLOAT) {
        if (bVar1 != 0xca) {
LAB_00131a95:
          pcStack_270 = (code *)0x131ab4;
          __assert_fail("c == 0xca",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                        ,0x97e,"float mp_decode_float(const char **)");
        }
        uVar4 = *(uint *)(pcVar17 + -1);
        fVar7 = (float)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                       uVar4 << 0x18);
        if ((fVar7 != local_258) || (NAN(fVar7) || NAN(local_258))) goto LAB_00131a6c;
        pcVar12 = pcVar17 + 3;
      }
      else if (mVar2 == MP_INT) {
        uVar8 = (ulong)(char)bVar1;
        switch(bVar1) {
        case 0xd0:
          uVar8 = (ulong)pcVar17[-1];
          break;
        case 0xd1:
          uVar8 = (ulong)(short)(*(ushort *)(pcVar17 + -1) << 8 | *(ushort *)(pcVar17 + -1) >> 8);
          pcVar12 = acStack_12f + lVar5 + -6;
          break;
        case 0xd2:
          uVar4 = *(uint *)(pcVar17 + -1);
          uVar8 = (ulong)(int)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                              uVar4 << 0x18);
          pcVar12 = acStack_12f + lVar5 + -4;
          break;
        case 0xd3:
          uVar8 = *(ulong *)(pcVar17 + -1);
          uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                  (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                  (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28
                  | uVar8 << 0x38;
          pcVar12 = acStack_12f + lVar10 * 0x10;
          break;
        default:
          if (bVar1 < 0xe0) {
            pcStack_270 = (code *)0x131a67;
            test_read_num<double,long_long,int(*)(char_const**,double*)>();
            goto LAB_00131a67;
          }
          pcVar12 = acStack_12f + (lVar10 * 2 + -1) * 8;
        }
        if (uVar8 != local_268) goto LAB_00131ab9;
      }
      else {
        if (bVar1 != 0xcb) goto LAB_00131a71;
        uVar8 = *(ulong *)(pcVar17 + -1);
        dVar9 = (double)(uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                         (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                         (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
                         (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38);
        if ((dVar9 != local_250) || (NAN(dVar9) || NAN(local_250))) {
          pcStack_270 = (code *)0x131a95;
          test_read_num<double,long_long,int(*)(char_const**,double*)>();
          goto LAB_00131a95;
        }
        pcVar12 = acStack_12f + lVar10 * 0x10;
      }
      unaff_RBP = pcVar17 + -2;
      pcVar16 = (char *)(ulong)(uint)(int)(char)bVar1;
      local_248 = 0.0;
      pcStack_270 = (code *)0x131948;
      local_260 = unaff_RBP;
      iVar3 = (*local_240)(&local_260,&local_248);
      if ((char)local_254 == '\0') {
        pcStack_270 = (code *)0x131a18;
        _ok((uint)(iVar3 == -1),"rc == -1",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x737,"check failure for code 0x%02X",pcVar16);
        bVar18 = unaff_RBP == local_260;
        pcVar12 = "mp_num_pos2 == mp_nums[i]";
        iVar3 = 0x738;
        fmt = "check position";
      }
      else {
        unaff_RBP = 
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc";
        pcStack_270 = (code *)0x131982;
        _ok((uint)(iVar3 == 0),"rc == 0",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73b,"check success for code 0x%02X",pcVar16);
        pcStack_270 = (code *)0x1319aa;
        _ok((uint)(pcVar12 == local_260),"mp_num_pos1 == mp_num_pos2",
            "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
            0x73c,"check position");
        bVar18 = ABS(local_250 - local_248) < 1e-15;
        pcVar12 = "double_eq(num1, num2)";
        iVar3 = 0x73e;
        fmt = "check float number";
      }
      mp_nums_00 = (char (*) [16])(ulong)bVar18;
      pcStack_270 = (code *)0x131a40;
      _ok((uint)bVar18,pcVar12,
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          iVar3,fmt);
      lVar10 = lVar10 + 1;
      pcVar17 = pcVar17 + 0x10;
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
  }
  return;
LAB_00131bd0:
  lVar6 = lVar10 * 0x10;
  bVar1 = *(byte *)((long)puVar15 + -2);
  uVar14 = (ulong)bVar1;
  mVar2 = mp_type_hint[uVar14];
  puVar11 = puVar15;
  if (mVar2 == MP_UINT) {
    switch(bVar1) {
    case 0xcc:
      uVar14 = (ulong)*(byte *)((long)puVar15 + -1);
      break;
    case 0xcd:
      uVar14 = (ulong)(ushort)(*(ushort *)((long)puVar15 + -1) << 8 |
                              *(ushort *)((long)puVar15 + -1) >> 8);
      puVar11 = (undefined8 *)(auStack_39d + lVar6);
      break;
    case 0xce:
      uVar4 = *(uint *)((long)puVar15 + -1);
      uVar14 = (ulong)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                      uVar4 << 0x18);
      puVar11 = (undefined8 *)(auStack_39d + lVar6 + 2);
      break;
    case 0xcf:
      uVar14 = *(ulong *)((long)puVar15 + -1);
      uVar14 = uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 |
               (uVar14 & 0xff0000000000) >> 0x18 | (uVar14 & 0xff00000000) >> 8 |
               (uVar14 & 0xff000000) << 8 | (uVar14 & 0xff0000) << 0x18 | (uVar14 & 0xff00) << 0x28
               | uVar14 << 0x38;
      puVar11 = &uStack_397 + lVar10 * 2;
      break;
    default:
      if ((char)bVar1 < '\0') {
LAB_00131e46:
        pcStack_4c8 = (code *)0x131e4b;
        test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_00131e4b:
        pcStack_4c8 = (code *)0x131e50;
        test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_00131e50:
        pcStack_4c8 = (code *)0x131e6f;
        __assert_fail("c == 0xcb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                      ,0x987,"double mp_decode_double(const char **)");
      }
      puVar11 = (undefined8 *)(auStack_39f + lVar6);
    }
    if (uVar14 != 0x642c88) {
      pcStack_4c8 = (code *)0x131e98;
      test_read_num<double,float,int(*)(char_const**,double*)>();
LAB_00131e98:
      pcStack_4c8 = test_read_num<double,double,int(*)(char_const**,double*)>;
      test_read_num<double,float,int(*)(char_const**,double*)>();
      builtin_strncpy(acStack_6d8,"typed read of ",0xf);
      puStack_4d8 = puVar11;
      pbStack_4d0 = __maxlen;
      pcStack_4c8 = (code *)lVar5;
      iVar3 = snprintf(acStack_6d8 + 0xe,0xf2,"%lf",0xc0163851eb851eb8);
      pcVar16 = acStack_6d8 + (long)iVar3 + 0xe;
      iVar3 = snprintf(pcVar16,(size_t)(&uStack_5d8 + -(long)pcVar16)," into ");
      snprintf(pcVar16 + iVar3,(size_t)(&uStack_5d8 + -(long)(pcVar16 + iVar3)),"double");
      _space((FILE *)_stdout);
      fwrite("# ",2,1,_stdout);
      fputs(acStack_6d8,_stdout);
      fputc(10,_stdout);
      uStack_5d8 = 0xcb;
      uStack_5d7 = 0xb81e85eb513816c0;
      puStack_6e0 = &uStack_5d8;
      dStack_6e8 = 0.0;
      iVar3 = (*pcVar13)(&puStack_6e0,&dStack_6e8);
      _ok((uint)(iVar3 == 0),"rc == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73b,"check success for code 0x%02X",0xffffffcb);
      _ok((uint)(auStack_5cf == puStack_6e0),"mp_num_pos1 == mp_num_pos2",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73c,"check position");
      _ok((uint)(ABS(-5.555 - dStack_6e8) < 1e-15),"double_eq(num1, num2)",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
          0x73e,"check float number");
      return;
    }
  }
  else if (mVar2 == MP_FLOAT) {
    if (bVar1 != 0xca) {
LAB_00131e74:
      pcStack_4c8 = (code *)0x131e93;
      __assert_fail("c == 0xca",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/../msgpuck.h"
                    ,0x97e,"float mp_decode_float(const char **)");
    }
    uVar4 = *(uint *)((long)puVar15 + -1);
    fVar7 = (float)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18)
    ;
    if ((fVar7 != 6.565e+06) || (NAN(fVar7))) goto LAB_00131e4b;
    puVar11 = (undefined8 *)((long)puVar15 + 3);
  }
  else if (mVar2 == MP_INT) {
    uVar14 = (ulong)(char)bVar1;
    switch(bVar1) {
    case 0xd0:
      uVar14 = (ulong)*(char *)((long)puVar15 + -1);
      break;
    case 0xd1:
      uVar14 = (ulong)(short)(*(ushort *)((long)puVar15 + -1) << 8 |
                             *(ushort *)((long)puVar15 + -1) >> 8);
      puVar11 = (undefined8 *)(auStack_39d + lVar6);
      break;
    case 0xd2:
      uVar4 = *(uint *)((long)puVar15 + -1);
      uVar14 = (ulong)(int)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                           uVar4 << 0x18);
      puVar11 = (undefined8 *)(auStack_39d + lVar6 + 2);
      break;
    case 0xd3:
      uVar14 = *(ulong *)((long)puVar15 + -1);
      uVar14 = uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 |
               (uVar14 & 0xff0000000000) >> 0x18 | (uVar14 & 0xff00000000) >> 8 |
               (uVar14 & 0xff000000) << 8 | (uVar14 & 0xff0000) << 0x18 | (uVar14 & 0xff00) << 0x28
               | uVar14 << 0x38;
      puVar11 = &uStack_397 + lVar10 * 2;
      break;
    default:
      if (bVar1 < 0xe0) {
        pcStack_4c8 = (code *)0x131e46;
        test_read_num<double,float,int(*)(char_const**,double*)>();
        goto LAB_00131e46;
      }
      puVar11 = (undefined8 *)(auStack_39f + lVar6);
    }
    if (uVar14 != 0x642c88) goto LAB_00131e98;
  }
  else {
    if (bVar1 != 0xcb) goto LAB_00131e50;
    uVar14 = *(ulong *)((long)puVar15 + -1);
    dVar9 = (double)(uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 |
                     (uVar14 & 0xff0000000000) >> 0x18 | (uVar14 & 0xff00000000) >> 8 |
                     (uVar14 & 0xff000000) << 8 | (uVar14 & 0xff0000) << 0x18 |
                     (uVar14 & 0xff00) << 0x28 | uVar14 << 0x38);
    if ((dVar9 != 6565000.0) || (NAN(dVar9))) {
      pcStack_4c8 = (code *)0x131e74;
      test_read_num<double,float,int(*)(char_const**,double*)>();
      goto LAB_00131e74;
    }
    puVar11 = &uStack_397 + lVar10 * 2;
  }
  puStack_4b0 = (undefined8 *)((long)puVar15 + -2);
  __maxlen = (byte *)(ulong)(uint)(int)(char)bVar1;
  dStack_4b8 = 0.0;
  pcStack_4c8 = (code *)0x131d8a;
  iVar3 = (*(code *)pacStack_4a8)(&puStack_4b0,&dStack_4b8);
  pcStack_4c8 = (code *)0x131db2;
  _ok((uint)(iVar3 == 0),"rc == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73b,
      "check success for code 0x%02X",__maxlen);
  pcStack_4c8 = (code *)0x131dda;
  _ok((uint)(puVar11 == puStack_4b0),"mp_num_pos1 == mp_num_pos2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73c,
      "check position");
  bVar18 = ABS(6565000.0 - dStack_4b8) < 1e-15;
  pcVar13 = (code *)(ulong)bVar18;
  pcStack_4c8 = (code *)0x131e1f;
  _ok((uint)bVar18,"double_eq(num1, num2)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x73e,
      "check float number");
  lVar10 = lVar10 + 1;
  puVar15 = puVar15 + 2;
  lVar5 = lVar5 + -1;
  if (lVar5 != 0) {
    return;
  }
  goto LAB_00131bd0;
}

Assistant:

static void
test_read_num(ValueT num1, ReadF read_f, bool is_ok)
{
	/*
	 * Build the header message.
	 */
	const int str_cap = 256;
	char str[str_cap];
	char *end = str + str_cap;
	char *pos = str + snprintf(str, str_cap, "typed read of ");
	if (std::is_same<ValueT, float>::value)
		pos += snprintf(pos, end - pos, "%f", (float)num1);
	else if (std::is_same<ValueT, double>::value)
		pos += snprintf(pos, end - pos, "%lf", (double)num1);
	else if (num1 >= 0)
		pos += snprintf(pos, end - pos, "%llu", (long long)num1);
	else
		pos += snprintf(pos, end - pos, "%lld", (long long)num1);
	pos += snprintf(pos, end - pos, " into ");

	static_assert(!std::is_same<TargetT, float>::value,
		      "no float reading");
	if (std::is_integral<TargetT>::value) {
		pos += snprintf(pos, end - pos, "int%zu_t",
				sizeof(TargetT) * 8);
	} else {
		pos += snprintf(pos, end - pos, "double");
	}
	note("%s", str);
	/*
	 * Perform the actual tests.
	 */
	char mp_nums[MP_NUMBER_CODEC_COUNT][MP_NUMBER_MAX_LEN];
	int count = 0;
	if (std::is_integral<ValueT>::value) {
		if (num1 >= 0) {
			count += test_encode_uint_all_sizes(
				&mp_nums[count], num1);
		}
		if (num1 <= INT64_MAX) {
			count += test_encode_int_all_sizes(
				&mp_nums[count], num1);
		}
	} else if (!std::is_integral<TargetT>::value || !is_ok) {
		/*
		 * Only encode floating point types when
		 * 1) expect to also decode them back successfully.
		 * 2) want to fail to decode an integer.
		 *
		 * Encoding integers as floats for decoding them back into
		 * integers won't work.
		 */
		if (std::is_same<ValueT, float>::value)
			mp_encode_float(mp_nums[count++], (float)num1);
		mp_encode_double(mp_nums[count++], (double)num1);
	}
	for (int i = 0; i < count; ++i) {
		const char *mp_num_pos1 = mp_nums[i];
		char code = *mp_num_pos1;
		/* Sanity check of the test encoding. */
		if (mp_typeof(*mp_num_pos1) == MP_INT) {
			fail_unless(mp_decode_int(&mp_num_pos1) ==
				    (int64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_UINT) {
			fail_unless(mp_decode_uint(&mp_num_pos1) ==
				    (uint64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_FLOAT) {
			fail_unless(mp_decode_float(&mp_num_pos1) ==
				    (float)num1);
		} else {
			fail_unless(mp_decode_double(&mp_num_pos1) ==
				    (double)num1);
		}

		const char *mp_num_pos2 = mp_nums[i];
		TargetT num2 = 0;
		int rc = read_f(&mp_num_pos2, &num2);
		if (!is_ok) {
			is(rc, -1, "check failure for code 0x%02X", code);
			is(mp_num_pos2, mp_nums[i], "check position");
			continue;
		}
		is(rc, 0, "check success for code 0x%02X", code);
		is(mp_num_pos1, mp_num_pos2, "check position");
		if (!std::is_integral<TargetT>::value) {
			ok(double_eq(num1, num2), "check float number");
			continue;
		}
		if (num1 >= 0) {
			fail_unless(num2 >= 0);
			is((uint64_t)num1, (uint64_t)num2, "check int number");
		} else {
			fail_unless(num2 < 0);
			is((int64_t)num1, (int64_t)num2, "check int number");
		}
	}
}